

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::select::render_input(select *this,form_context *context)

{
  ostream *out;
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  void *p;
  pointer peVar5;
  char *pcVar6;
  escape local_80;
  form_context *local_58;
  streamable local_50;
  
  base_widget::auto_generate((base_widget *)this,context);
  out = form_context::out(context);
  if (context->widget_part_type_ != 0) {
    local_58 = context;
    std::__ostream_insert<char,std::char_traits<char>>(out," >\n",3);
    peVar5 = (this->super_select_base).elements_.
             super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->super_select_base).elements_.
        super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
        ._M_impl.super__Vector_impl_data._M_finish != peVar5) {
      uVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"<option value=\"",0xf);
        util::escape((string *)&local_80,&peVar5[uVar4].id);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(char *)local_80.obj_.ptr_,(long)local_80.obj_.to_stream_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
        if ((to_string_type *)local_80.obj_.ptr_ != &local_80.obj_.to_string_) {
          operator_delete(local_80.obj_.ptr_);
        }
        if ((int)uVar4 == (this->super_select_base).selected_) {
          if (local_58->html_type_ == 1) {
            lVar3 = 0x14;
            pcVar6 = "selected=\"selected\" ";
          }
          else {
            lVar3 = 9;
            pcVar6 = "selected ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar3);
        }
        peVar5 = peVar5 + uVar4;
        std::__ostream_insert<char,std::char_traits<char>>(out,">",1);
        if ((undefined1  [208])((undefined1  [208])*peVar5 & (undefined1  [208])0x1) ==
            (undefined1  [208])0x0) {
          util::escape((string *)&local_80,&peVar5->str_option);
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,(char *)local_80.obj_.ptr_,(long)local_80.obj_.to_stream_);
          if ((to_string_type *)local_80.obj_.ptr_ != &local_80.obj_.to_string_) {
            operator_delete(local_80.obj_.ptr_);
          }
        }
        else {
          filters::streamable::set
                    (&local_50,&peVar5->tr_option,
                     filters::streamable::to_stream<booster::locale::basic_message<char>>,
                     filters::streamable::to_string<booster::locale::basic_message<char>>,
                     (type_info *)&booster::locale::basic_message<char>::typeinfo);
          filters::escape::escape(&local_80,&local_50);
          filters::escape::operator()(&local_80,out);
          filters::escape::~escape(&local_80);
          filters::streamable::~streamable(&local_50);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"</option>\n",10);
        uVar4 = (ulong)((int)uVar4 + 1);
        peVar5 = (this->super_select_base).elements_.
                 super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = ((long)(this->super_select_base).elements_.
                       super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)peVar5 >> 4) *
                0x4ec4ec4ec4ec4ec5;
      } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"</select>",9);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"<select ",8);
  (*(this->super_select_base).super_base_widget.super_base_form._vptr_base_form[9])(this,context);
  return;
}

Assistant:

void select::render_input(form_context &context)
{
	auto_generate(&context);
	std::ostream &out=context.out();
	if(context.widget_part() == first_part) {
		out<<"<select ";
		render_attributes(context);
	}
	else {
		out<<" >\n";
		for(unsigned i=0;i<elements_.size();i++) {
			element &el=elements_[i];
			out << "<option value=\"" << util::escape(el.id) <<"\" ";
			if(int(i) == selected()) {
				if(context.html() == as_xhtml)
					out << "selected=\"selected\" ";
				else
					out << "selected ";
			}
			out << ">";
			if(el.need_translation)
				out << filters::escape(el.tr_option);
			else
				out << util::escape(el.str_option);
			out << "</option>\n";
		}
		out << "</select>";
	}
}